

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * CGSIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim_00;
  Vector *pVVar3;
  double bNorm_00;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 local_1f0 [8];
  Vector v_;
  Vector u_;
  Vector u;
  Vector q;
  Vector p_;
  Vector p;
  Vector r_;
  Vector r;
  size_t Dim;
  double bNorm;
  double RhoOld;
  double Rho;
  double Beta;
  double Alpha;
  int Iter;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  bNorm = 0.0;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim_00 = Q_GetDim(A);
  V_Constr((Vector *)&r_.Cmp,"r",Dim_00,Normal,True);
  V_Constr((Vector *)&p.Cmp,"r_",Dim_00,Normal,True);
  V_Constr((Vector *)&p_.Cmp,"p",Dim_00,Normal,True);
  V_Constr((Vector *)&u.Cmp,"q",Dim_00,Normal,True);
  V_Constr((Vector *)&u_.Cmp,"u",Dim_00,Normal,True);
  V_Constr((Vector *)&v_.Cmp,"u_",Dim_00,Normal,True);
  V_Constr((Vector *)local_1f0,"v_",Dim_00,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr((Vector *)&q.Cmp,"p_",Dim_00,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    Alpha._4_4_ = 0;
    dVar4 = l1Norm_V(x);
    auVar6._8_4_ = (int)(Dim_00 >> 0x20);
    auVar6._0_8_ = Dim_00;
    auVar6._12_4_ = 0x45300000;
    if (ABS(dVar4 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)&r_.Cmp,b);
    }
    else {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)&r_.Cmp,pVVar3);
    }
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      Asgn_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
      while( true ) {
        dVar4 = l2Norm_V((Vector *)&r_.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar4,bNorm_00,CGSIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        dVar4 = Mul_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
        if (ABS(dVar4) < 2.2250738585072014e-307) {
          LASError(LASBreakdownErr,"CGSIter","Rho",(char *)0x0,(char *)0x0);
          break;
        }
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&u_.Cmp,(Vector *)&r_.Cmp);
          Asgn_VV((Vector *)&p_.Cmp,(Vector *)&u_.Cmp);
        }
        else {
          dVar5 = dVar4 / bNorm;
          pVVar3 = Mul_SV(dVar5,(Vector *)&u.Cmp);
          pVVar3 = Add_VV((Vector *)&r_.Cmp,pVVar3);
          Asgn_VV((Vector *)&u_.Cmp,pVVar3);
          pVVar3 = Mul_SV(dVar5,(Vector *)&p_.Cmp);
          pVVar3 = Add_VV((Vector *)&u.Cmp,pVVar3);
          pVVar3 = Mul_SV(dVar5,pVVar3);
          pVVar3 = Add_VV((Vector *)&u_.Cmp,pVVar3);
          Asgn_VV((Vector *)&p_.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&p_.Cmp);
        Asgn_VV((Vector *)local_1f0,pVVar3);
        dVar5 = Mul_VV((Vector *)&p.Cmp,(Vector *)local_1f0);
        dVar5 = dVar4 / dVar5;
        pVVar3 = Mul_SV(dVar5,(Vector *)local_1f0);
        pVVar3 = Sub_VV((Vector *)&u_.Cmp,pVVar3);
        Asgn_VV((Vector *)&u.Cmp,pVVar3);
        pVVar3 = Add_VV((Vector *)&u_.Cmp,(Vector *)&u.Cmp);
        Asgn_VV((Vector *)&v_.Cmp,pVVar3);
        pVVar3 = Mul_SV(dVar5,(Vector *)&v_.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_QV(A,(Vector *)&v_.Cmp);
        pVVar3 = Mul_SV(dVar5,pVVar3);
        SubAsgn_VV((Vector *)&r_.Cmp,pVVar3);
        bNorm = dVar4;
      }
    }
    else {
      Asgn_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
      while( true ) {
        dVar4 = l2Norm_V((Vector *)&r_.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar4,bNorm_00,CGSIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        dVar4 = Mul_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
        if (ABS(dVar4) < 2.2250738585072014e-307) {
          LASError(LASBreakdownErr,"CGSIter","Rho",(char *)0x0,(char *)0x0);
          break;
        }
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&u_.Cmp,(Vector *)&r_.Cmp);
          Asgn_VV((Vector *)&p_.Cmp,(Vector *)&u_.Cmp);
        }
        else {
          dVar5 = dVar4 / bNorm;
          pVVar3 = Mul_SV(dVar5,(Vector *)&u.Cmp);
          pVVar3 = Add_VV((Vector *)&r_.Cmp,pVVar3);
          Asgn_VV((Vector *)&u_.Cmp,pVVar3);
          pVVar3 = Mul_SV(dVar5,(Vector *)&p_.Cmp);
          pVVar3 = Add_VV((Vector *)&u.Cmp,pVVar3);
          pVVar3 = Mul_SV(dVar5,pVVar3);
          pVVar3 = Add_VV((Vector *)&u_.Cmp,pVVar3);
          Asgn_VV((Vector *)&p_.Cmp,pVVar3);
        }
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)&q.Cmp,(Vector *)&p_.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)&q.Cmp,(Vector *)&p_.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)&q.Cmp,A);
        }
        pVVar3 = Mul_QV(A,(Vector *)&q.Cmp);
        Asgn_VV((Vector *)local_1f0,pVVar3);
        dVar5 = Mul_VV((Vector *)&p.Cmp,(Vector *)local_1f0);
        dVar5 = dVar4 / dVar5;
        pVVar3 = Mul_SV(dVar5,(Vector *)local_1f0);
        pVVar3 = Sub_VV((Vector *)&u_.Cmp,pVVar3);
        Asgn_VV((Vector *)&u.Cmp,pVVar3);
        if (PrecondProc == (PrecondProcType)0x0) {
          pVVar3 = Add_VV((Vector *)&u_.Cmp,(Vector *)&u.Cmp);
          Asgn_VV((Vector *)&v_.Cmp,pVVar3);
        }
        else {
          pVVar3 = Add_VV((Vector *)&u_.Cmp,(Vector *)&u.Cmp);
          (*PrecondProc)(A,(Vector *)&v_.Cmp,pVVar3,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)&v_.Cmp,A);
        }
        pVVar3 = Mul_SV(dVar5,(Vector *)&v_.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_QV(A,(Vector *)&v_.Cmp);
        pVVar3 = Mul_SV(dVar5,pVVar3);
        SubAsgn_VV((Vector *)&r_.Cmp,pVVar3);
        bNorm = dVar4;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr((Vector *)&r_.Cmp);
  V_Destr((Vector *)&p.Cmp);
  V_Destr((Vector *)&p_.Cmp);
  V_Destr((Vector *)&u.Cmp);
  V_Destr((Vector *)&u_.Cmp);
  V_Destr((Vector *)&v_.Cmp);
  V_Destr((Vector *)local_1f0);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr((Vector *)&q.Cmp);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGSIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, q, u, u_, v_;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    V_Constr(&u, "u", Dim, Normal, True);
    V_Constr(&u_, "u_", Dim, Normal, True);
    V_Constr(&v_, "v_", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&p_, "p_", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CGS */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGSIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "CGSIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&u, &r);
                    Asgn_VV(&p, &u);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&u, Add_VV(&r, Mul_SV(Beta, &q)));
                    Asgn_VV(&p, Add_VV(&u, Mul_SV(Beta, Add_VV(&q, Mul_SV(Beta, &p)))));
                }
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &p_, &p, OmegaPrecond);
	        else
		    Asgn_VV(&p_, &p);
		if (Q_KerDefined(A))
		    OrthoRightKer_VQ(&p_, A);
                Asgn_VV(&v_, Mul_QV(A, &p_));
                Alpha = Rho / Mul_VV(&r_, &v_);
                Asgn_VV(&q, Sub_VV(&u, Mul_SV(Alpha, &v_)));
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &u_, Add_VV(&u, &q), OmegaPrecond);
	        else
		    Asgn_VV(&u_, Add_VV(&u, &q));
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&u_, A);
                AddAsgn_VV(x, Mul_SV(Alpha, &u_));
                SubAsgn_VV(&r, Mul_SV(Alpha, Mul_QV(A, &u_)));
                RhoOld = Rho;
            }
        } else {
            /* plain CGS (p_ = p) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGSIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "CGSIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&u, &r);
                    Asgn_VV(&p, &u);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&u, Add_VV(&r, Mul_SV(Beta, &q)));
                    Asgn_VV(&p, Add_VV(&u, Mul_SV(Beta, Add_VV(&q, Mul_SV(Beta, &p)))));
                }
                Asgn_VV(&v_, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&r_, &v_);
                Asgn_VV(&q, Sub_VV(&u, Mul_SV(Alpha, &v_)));
                Asgn_VV(&u_, Add_VV(&u, &q));
                AddAsgn_VV(x, Mul_SV(Alpha, &u_));
                SubAsgn_VV(&r, Mul_SV(Alpha, Mul_QV(A, &u_)));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
      
    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&q);
    V_Destr(&u);
    V_Destr(&u_);
    V_Destr(&v_);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&p_);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}